

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_compatibleUnitsInDifferentModelsChildNotFound_Test::
~Units_compatibleUnitsInDifferentModelsChildNotFound_Test
          (Units_compatibleUnitsInDifferentModelsChildNotFound_Test *this)

{
  Units_compatibleUnitsInDifferentModelsChildNotFound_Test *this_local;
  
  ~Units_compatibleUnitsInDifferentModelsChildNotFound_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, compatibleUnitsInDifferentModelsChildNotFound)
{
    auto m1 = libcellml::Model::create("nurseryrhymes");
    auto m2 = libcellml::Model::create("farmwork");
    auto u1 = libcellml::Units::create("bo_peep");
    u1->addUnit("sheep");

    auto u2 = libcellml::Units::create("flock");
    auto u3 = libcellml::Units::create("sheep");
    u2->addUnit("sheep");

    m1->addUnits(u1);
    m2->addUnits(u2);
    m2->addUnits(u3);

    // Child unit of "sheep" exists only in m2, return 0.0.
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
}